

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableGcCompactSettings(void)

{
  ImChunkStream<ImGuiTableSettings> *this;
  int iVar1;
  int iVar2;
  char *pcVar3;
  ImGuiContext_conflict1 *pIVar4;
  ImGuiTableSettings *pIVar5;
  char *__dest;
  ImGuiTableSettings *__dest_00;
  uint uVar6;
  ImVector_char local_38;
  
  pIVar4 = GImGui;
  this = &GImGui->SettingsTables;
  pcVar3 = (GImGui->SettingsTables).Buf.Data;
  if (pcVar3 == (char *)0x0) {
    if ((this->Buf).Size == 0) {
      return;
    }
    local_38.Size = 0;
    local_38.Capacity = 0;
    local_38.Data = (char *)0x0;
  }
  else {
    pIVar5 = (ImGuiTableSettings *)(pcVar3 + 4);
    uVar6 = 0;
    do {
      if (pIVar5->ID != 0) {
        uVar6 = uVar6 + 0x10 + pIVar5->ColumnsCount * 0xc;
      }
      pIVar5 = ImChunkStream<ImGuiTableSettings>::next_chunk(this,pIVar5);
    } while (pIVar5 != (ImGuiTableSettings *)0x0);
    if (uVar6 == (this->Buf).Size) {
      return;
    }
    local_38.Size = 0;
    local_38.Capacity = 0;
    local_38.Data = (char *)0x0;
    if (0 < (int)uVar6) {
      __dest = (char *)MemAlloc((ulong)uVar6);
      pcVar3 = local_38.Data;
      if (local_38.Data != (char *)0x0) {
        memcpy(__dest,local_38.Data,(long)local_38.Size);
        MemFree(pcVar3);
      }
      local_38.Capacity = uVar6;
      local_38.Data = __dest;
    }
  }
  pcVar3 = (pIVar4->SettingsTables).Buf.Data;
  pIVar5 = (ImGuiTableSettings *)(pcVar3 + 4);
  if (pcVar3 == (char *)0x0) {
    pIVar5 = (ImGuiTableSettings *)0x0;
  }
  for (; pIVar5 != (ImGuiTableSettings *)0x0;
      pIVar5 = ImChunkStream<ImGuiTableSettings>::next_chunk(this,pIVar5)) {
    if (pIVar5->ID != 0) {
      __dest_00 = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                            ((ImChunkStream<ImGuiTableSettings> *)&local_38,
                             (long)pIVar5->ColumnsCount * 0xc + 0x10);
      memcpy(__dest_00,pIVar5,(long)pIVar5->ColumnsCount * 0xc + 0x10);
    }
  }
  iVar1 = (pIVar4->SettingsTables).Buf.Size;
  (pIVar4->SettingsTables).Buf.Size = local_38.Size;
  iVar2 = (pIVar4->SettingsTables).Buf.Capacity;
  (pIVar4->SettingsTables).Buf.Capacity = local_38.Capacity;
  local_38.Capacity = iVar2;
  local_38.Size = iVar1;
  pcVar3 = (pIVar4->SettingsTables).Buf.Data;
  (pIVar4->SettingsTables).Buf.Data = local_38.Data;
  if (pcVar3 != (char *)0x0) {
    local_38.Data = pcVar3;
    MemFree(pcVar3);
  }
  return;
}

Assistant:

void ImGui::TableGcCompactSettings()
{
    ImGuiContext& g = *GImGui;
    int required_memory = 0;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            required_memory += (int)TableSettingsCalcChunkSize(settings->ColumnsCount);
    if (required_memory == g.SettingsTables.Buf.Size)
        return;
    ImChunkStream<ImGuiTableSettings> new_chunk_stream;
    new_chunk_stream.Buf.reserve(required_memory);
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            memcpy(new_chunk_stream.alloc_chunk(TableSettingsCalcChunkSize(settings->ColumnsCount)), settings, TableSettingsCalcChunkSize(settings->ColumnsCount));
    g.SettingsTables.swap(new_chunk_stream);
}